

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

LY_ERR parse_refine(lysp_yang_ctx *ctx,lysp_refine **refines)

{
  lysp_refine *plVar1;
  long lVar2;
  lyd_node *plVar3;
  size_t len;
  LY_ERR LVar4;
  long *plVar5;
  char *pcVar6;
  uint16_t *puVar7;
  char *format;
  lysp_restr **extraout_RDX;
  lysp_restr **extraout_RDX_00;
  lysp_qname **qnames;
  lysp_restr **extraout_RDX_01;
  lysp_restr **extraout_RDX_02;
  lysp_restr **restrs;
  ly_ctx *plVar8;
  ly_stmt lVar9;
  void *parent;
  lysp_ext_instance **pplVar10;
  lysp_ext_instance **pplVar11;
  uint16_t *puVar12;
  bool bVar13;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  undefined4 in_stack_ffffffffffffff60;
  ly_stmt in_stack_ffffffffffffff64;
  char *local_98;
  size_t local_90;
  uint16_t *local_88;
  lysp_qname **local_80;
  lysp_qname **local_78;
  uint16_t *local_70;
  uint32_t *local_68;
  uint32_t *local_60;
  uint16_t *local_58;
  uint16_t *local_50;
  uint16_t *local_48;
  lysp_ext_instance **local_40;
  char *local_38;
  
  plVar1 = *refines;
  if (plVar1 == (lysp_refine *)0x0) {
    plVar5 = (long *)malloc(0x58);
    if (plVar5 != (long *)0x0) {
      *plVar5 = 1;
      goto LAB_0017c1a6;
    }
  }
  else {
    lVar2 = *(long *)&plVar1[-1].flags;
    *(long *)&plVar1[-1].flags = lVar2 + 1;
    plVar5 = (long *)realloc(&plVar1[-1].flags,lVar2 * 0x50 + 0x58);
    if (plVar5 != (long *)0x0) {
LAB_0017c1a6:
      *refines = (lysp_refine *)(plVar5 + 1);
      lVar2 = *plVar5;
      plVar5[lVar2 * 10 + -1] = 0;
      (plVar5 + lVar2 * 10 + -1)[1] = 0;
      plVar5[lVar2 * 10 + -3] = 0;
      (plVar5 + lVar2 * 10 + -3)[1] = 0;
      plVar5[lVar2 * 10 + -5] = 0;
      (plVar5 + lVar2 * 10 + -5)[1] = 0;
      plVar5[lVar2 * 10 + -7] = 0;
      (plVar5 + lVar2 * 10 + -7)[1] = 0;
      plVar5[lVar2 * 10 + -9] = 0;
      (plVar5 + lVar2 * 10 + -9)[1] = 0;
      LVar4 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&local_98,&local_38,&local_90);
      len = local_90;
      if (LVar4 != LY_SUCCESS) {
        return LVar4 + (LVar4 == LY_SUCCESS);
      }
      if (local_90 == 0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_log(plVar8,LY_LLWRN,LY_SUCCESS,"Empty argument of %s statement does not make sense.",
               "refine");
      }
      pplVar10 = (lysp_ext_instance **)(plVar5 + lVar2 * 10 + -9);
      pplVar11 = pplVar10;
      if (local_38 == (char *)0x0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar6 = local_98;
        if (len == 0) {
          pcVar6 = "";
        }
        LVar4 = lydict_insert(plVar8,pcVar6,len,(char **)pplVar10);
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar4 = lydict_insert_zc(plVar8,local_98,(char **)pplVar10);
      }
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      local_40 = pplVar10;
      LVar4 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff64,&local_98,&local_90);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      if (in_stack_ffffffffffffff64 == LY_STMT_SYNTAX_SEMICOLON) {
        bVar13 = true;
        restrs = extraout_RDX;
      }
      else {
        if (in_stack_ffffffffffffff64 != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar8 = (ly_ctx *)0x0;
          }
          else {
            plVar8 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar6 = lyplg_ext_stmt2str(in_stack_ffffffffffffff64);
          ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar6);
          return LY_EVALID;
        }
        LVar4 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff64,&local_98,&local_90);
        if (LVar4 != LY_SUCCESS) {
          return LVar4;
        }
        bVar13 = in_stack_ffffffffffffff64 == LY_STMT_SYNTAX_RIGHT_BRACE;
        restrs = extraout_RDX_00;
      }
      if (bVar13) {
        return LY_SUCCESS;
      }
      puVar12 = (uint16_t *)(plVar5 + lVar2 * 10);
      pplVar10 = (lysp_ext_instance **)(puVar12 + -4);
      local_48 = puVar12 + -0x10;
      local_50 = puVar12 + -0x1c;
      local_58 = puVar12 + -0x14;
      local_60 = (uint32_t *)(puVar12 + -8);
      local_68 = (uint32_t *)(puVar12 + -6);
      local_80 = (lysp_qname **)(puVar12 + -0x18);
      local_70 = puVar12 + -0x20;
      local_78 = (lysp_qname **)(puVar12 + -0xc);
      local_88 = puVar12;
      do {
        if ((int)in_stack_ffffffffffffff64 < 0x180000) {
          if ((int)in_stack_ffffffffffffff64 < 0x80000) {
            if (in_stack_ffffffffffffff64 == LY_STMT_CONFIG) {
              LVar4 = parse_config(ctx,local_88,pplVar10);
            }
            else {
              if (in_stack_ffffffffffffff64 != LY_STMT_DEFAULT) goto LAB_0017c681;
              lVar9 = LY_STMT_DEFAULT;
              qnames = local_78;
LAB_0017c513:
              LVar4 = parse_qnames(ctx,lVar9,qnames,(yang_arg)pplVar10,pplVar11);
            }
          }
          else {
            if (in_stack_ffffffffffffff64 == LY_STMT_DESCRIPTION) {
              parent = *(void **)local_70;
              lVar9 = LY_STMT_DESCRIPTION;
              puVar7 = local_70;
              goto LAB_0017c585;
            }
            if (in_stack_ffffffffffffff64 != LY_STMT_EXTENSION_INSTANCE) {
              if (in_stack_ffffffffffffff64 == LY_STMT_IF_FEATURE) {
                plVar3 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                if (*(byte *)&plVar3[2].schema < 2) {
                  if (ctx == (lysp_yang_ctx *)0x0) {
                    plVar8 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar8 = (ly_ctx *)**(undefined8 **)plVar3;
                  }
                  format = 
                  "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                  ;
                  pcVar6 = "if-feature";
                  goto LAB_0017c6ee;
                }
                lVar9 = LY_STMT_IF_FEATURE;
                qnames = local_80;
                goto LAB_0017c513;
              }
LAB_0017c681:
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar8 = (ly_ctx *)0x0;
              }
              else {
                plVar8 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar6 = lyplg_ext_stmt2str(in_stack_ffffffffffffff64);
              format = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_0017c6ee:
              ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar6,"refine");
              return LY_EVALID;
            }
            pplVar11 = (lysp_ext_instance **)0x280000;
            LVar4 = parse_ext(ctx,local_98,local_90,local_40,LY_STMT_REFINE,0,pplVar10);
          }
        }
        else if ((int)in_stack_ffffffffffffff64 < 0x1d0000) {
          if (in_stack_ffffffffffffff64 == LY_STMT_MANDATORY) {
            LVar4 = parse_mandatory(ctx,local_88,pplVar10);
          }
          else if (in_stack_ffffffffffffff64 == LY_STMT_MAX_ELEMENTS) {
            LVar4 = parse_maxelements(ctx,local_68,local_88,pplVar10);
          }
          else {
            if (in_stack_ffffffffffffff64 != LY_STMT_MIN_ELEMENTS) goto LAB_0017c681;
            LVar4 = parse_minelements(ctx,local_60,local_88,pplVar10);
          }
        }
        else if (in_stack_ffffffffffffff64 == LY_STMT_MUST) {
          LVar4 = parse_restrs(ctx,(ly_stmt)local_58,restrs);
        }
        else {
          if (in_stack_ffffffffffffff64 == LY_STMT_PRESENCE) {
            parent = *(void **)local_48;
            lVar9 = LY_STMT_PRESENCE;
            puVar7 = local_48;
          }
          else {
            if (in_stack_ffffffffffffff64 != LY_STMT_REFERENCE) goto LAB_0017c681;
            parent = *(void **)local_50;
            lVar9 = LY_STMT_REFERENCE;
            puVar7 = local_50;
          }
LAB_0017c585:
          pplVar11 = (lysp_ext_instance **)0x2;
          LVar4 = parse_text_field(ctx,parent,lVar9,(uint32_t)puVar7,(char **)0x2,Y_IDENTIF_ARG,
                                   (uint16_t *)pplVar10,
                                   (lysp_ext_instance **)
                                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        }
        if (LVar4 != LY_SUCCESS) {
          return LVar4;
        }
        LVar4 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff64,&local_98,&local_90);
        if (LVar4 != LY_SUCCESS) {
          return LVar4;
        }
        restrs = extraout_RDX_01;
        if (in_stack_ffffffffffffff64 == LY_STMT_SYNTAX_RIGHT_BRACE) {
          bVar13 = true;
          if ((*(void **)(puVar12 + -4) != (void *)0x0) &&
             (LVar4 = ly_set_add(&ctx->main_ctx->ext_inst,*(void **)(puVar12 + -4),'\x01',
                                 (uint32_t *)0x0), restrs = extraout_RDX_02, LVar4 != LY_SUCCESS)) {
            return LVar4;
          }
        }
        if (bVar13) {
          return LY_SUCCESS;
        }
      } while( true );
    }
    *(long *)&(*refines)[-1].flags = *(long *)&(*refines)[-1].flags + -1;
  }
  if (ctx == (lysp_yang_ctx *)0x0) {
    plVar8 = (ly_ctx *)0x0;
  }
  else {
    plVar8 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_refine");
  return LY_EMEM;
}

Assistant:

static LY_ERR
parse_refine(struct lysp_yang_ctx *ctx, struct lysp_refine **refines)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_refine *rf;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *refines, rf, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len));
    CHECK_NONEMPTY(ctx, word_len, "refine");
    INSERT_WORD_GOTO(ctx, buf, rf->nodeid, word, word_len, ret, cleanup);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(parse_config(ctx, &rf->flags, &rf->exts));
            break;
        case LY_STMT_DEFAULT:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_DEFAULT, &rf->dflts, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, rf->dsc, LY_STMT_DESCRIPTION, 0, &rf->dsc, Y_STR_ARG, NULL, &rf->exts));
            break;
        case LY_STMT_IF_FEATURE:
            PARSER_CHECK_STMTVER2_RET(ctx, "if-feature", "refine");
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &rf->iffeatures, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_MAX_ELEMENTS:
            LY_CHECK_RET(parse_maxelements(ctx, &rf->max, &rf->flags, &rf->exts));
            break;
        case LY_STMT_MIN_ELEMENTS:
            LY_CHECK_RET(parse_minelements(ctx, &rf->min, &rf->flags, &rf->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(parse_restrs(ctx, kw, &rf->musts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(parse_mandatory(ctx, &rf->flags, &rf->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, rf->ref, LY_STMT_REFERENCE, 0, &rf->ref, Y_STR_ARG, NULL, &rf->exts));
            break;
        case LY_STMT_PRESENCE:
            LY_CHECK_RET(parse_text_field(ctx, rf->presence, LY_STMT_PRESENCE, 0, &rf->presence, Y_STR_ARG, NULL, &rf->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, rf, LY_STMT_REFINE, 0, &rf->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "refine");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, rf->exts, ret, cleanup);
    }

cleanup:
    return ret;
}